

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void GetBestGreenToRed(uint32_t *argb,int stride,int tile_width,int tile_height,
                      VP8LMultipliers prev_x,VP8LMultipliers prev_y,int quality,
                      uint32_t *accumulated_red_histo,VP8LMultipliers *best_tx)

{
  int iVar1;
  int64_t iVar2;
  int in_stack_00000008;
  int64_t cur_diff;
  int green_to_red_cur;
  int delta;
  int64_t best_diff;
  int offset;
  int iter;
  int green_to_red_best;
  int kMaxIters;
  int in_stack_000003ac;
  int in_stack_000003b0;
  int in_stack_000003b4;
  uint32_t *in_stack_000003b8;
  VP8LMultipliers in_stack_000003c2;
  VP8LMultipliers in_stack_000003c5;
  int in_stack_000003d0;
  uint32_t *in_stack_000003d8;
  undefined8 local_38;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = 0;
  local_38 = GetPredictionCostCrossColorRed
                       (in_stack_000003b8,in_stack_000003b4,in_stack_000003b0,in_stack_000003ac,
                        in_stack_000003c5,in_stack_000003c2,in_stack_000003d0,in_stack_000003d8);
  for (local_28 = 0; local_28 < (in_stack_00000008 * 7 >> 8) + 4; local_28 = local_28 + 1) {
    iVar1 = 0x20 >> ((byte)local_28 & 0x1f);
    for (local_2c = -iVar1; local_2c <= iVar1; local_2c = iVar1 * 2 + local_2c) {
      iVar2 = GetPredictionCostCrossColorRed
                        (in_stack_000003b8,in_stack_000003b4,in_stack_000003b0,in_stack_000003ac,
                         in_stack_000003c5,in_stack_000003c2,in_stack_000003d0,in_stack_000003d8);
      if (iVar2 < local_38) {
        local_38 = iVar2;
        local_24 = local_2c + local_24;
      }
    }
  }
  *(char *)cur_diff = (char)local_24;
  return;
}

Assistant:

static void GetBestGreenToRed(const uint32_t* argb, int stride, int tile_width,
                              int tile_height, VP8LMultipliers prev_x,
                              VP8LMultipliers prev_y, int quality,
                              const uint32_t accumulated_red_histo[256],
                              VP8LMultipliers* const best_tx) {
  const int kMaxIters = 4 + ((7 * quality) >> 8);  // in range [4..6]
  int green_to_red_best = 0;
  int iter, offset;
  int64_t best_diff = GetPredictionCostCrossColorRed(
      argb, stride, tile_width, tile_height, prev_x, prev_y, green_to_red_best,
      accumulated_red_histo);
  for (iter = 0; iter < kMaxIters; ++iter) {
    // ColorTransformDelta is a 3.5 bit fixed point, so 32 is equal to
    // one in color computation. Having initial delta here as 1 is sufficient
    // to explore the range of (-2, 2).
    const int delta = 32 >> iter;
    // Try a negative and a positive delta from the best known value.
    for (offset = -delta; offset <= delta; offset += 2 * delta) {
      const int green_to_red_cur = offset + green_to_red_best;
      const int64_t cur_diff = GetPredictionCostCrossColorRed(
          argb, stride, tile_width, tile_height, prev_x, prev_y,
          green_to_red_cur, accumulated_red_histo);
      if (cur_diff < best_diff) {
        best_diff = cur_diff;
        green_to_red_best = green_to_red_cur;
      }
    }
  }
  best_tx->green_to_red = (green_to_red_best & 0xff);
}